

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,1,3,false>,Eigen::internal::assign_op<double,double>>
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *dst,
               Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false> *src,
               assign_op<double,_double> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  plainobjectbase_evaluator_data<double,_0> local_40;
  SrcEvaluatorType local_38;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_20;
  
  local_38.super_block_evaluator<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  .m_data = (src->super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_Eigen::Dense>
            ).super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_0>.
            m_data;
  local_20.m_src = &local_38;
  local_38.super_block_evaluator<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  .m_innerStride.m_value =
       (((src->super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_true>.m_xpr)->
       super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_rows;
  local_40.data = (double *)dst->m_matrix;
  local_20.m_dst = (DstEvaluatorType *)&local_40;
  local_20.m_functor = func;
  local_20.m_dstExpr = dst;
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_3>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}